

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

bool __thiscall adios2::ADIOS::RemoveIO(ADIOS *this,string *name)

{
  byte bVar1;
  element_type *peVar2;
  string *in_RSI;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string *this_00;
  string local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa8;
  ADIOS *in_stack_ffffffffffffffb0;
  string local_30 [48];
  
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  CheckPointer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  peVar2 = std::__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2864c2);
  this_00 = local_80;
  std::__cxx11::string::string(this_00,in_RSI);
  bVar1 = adios2::core::ADIOS::RemoveIO(peVar2,this_00);
  std::__cxx11::string::~string(local_80);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ADIOS::RemoveIO(const std::string name)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::RemoveIO");
    return m_ADIOS->RemoveIO(name);
}